

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bin_io_text_read.cpp
# Opt level: O3

bool __thiscall
ritobin::io::impl_text_read::BinTextReader::read_array<unsigned_char,4ul>
          (BinTextReader *this,array<unsigned_char,_4UL> *value)

{
  bool bVar1;
  byte bVar2;
  byte bVar3;
  undefined8 in_RCX;
  char *pos;
  char *msg;
  long lVar4;
  bool end;
  bool local_29;
  
  local_29 = false;
  pos = (this->reader).cur_;
  bVar1 = TextReader::read_nested_begin(&this->reader,&local_29);
  if (!bVar1) {
    msg = "reader.read_nested_begin(end)";
LAB_0012f3cd:
    bVar3 = fail_msg(this,msg,pos);
    goto LAB_0012f3d2;
  }
  if (local_29 == false) {
    lVar4 = 0;
    do {
      pos = (this->reader).cur_;
      if (lVar4 == 4) {
        msg = "counter < S";
        goto LAB_0012f3cd;
      }
      bVar1 = TextReader::read_number<unsigned_char>(&this->reader,value->_M_elems + lVar4);
      if (!bVar1) {
        msg = "reader.read_number(value[counter])";
        goto LAB_0012f3cd;
      }
      pos = (this->reader).cur_;
      bVar1 = TextReader::read_nested_separator_or_end(&this->reader,&local_29);
      bVar2 = (byte)in_RCX;
      if (!bVar1) {
        msg = "reader.read_nested_separator_or_end(end)";
        goto LAB_0012f3cd;
      }
      lVar4 = lVar4 + 1;
    } while (local_29 != true);
    if (lVar4 != 4) goto LAB_0012f33b;
    bVar3 = 1;
  }
  else {
LAB_0012f33b:
    bVar2 = fail_msg(this,"counter == static_cast<uint32_t>(S)",(this->reader).cur_);
    bVar3 = 0;
  }
  bVar3 = bVar3 | bVar2;
LAB_0012f3d2:
  return (bool)(bVar3 & 1);
}

Assistant:

bool read_array(std::array<T, S>& value) noexcept {
            uint32_t counter = 0;
            bool end = false;
            bin_assert(reader.read_nested_begin(end));
            while (!end) {
                bin_assert(counter < S);
                bin_assert(reader.read_number(value[counter]));
                bin_assert(reader.read_nested_separator_or_end(end));
                counter++;
            }
            bin_assert(counter == static_cast<uint32_t>(S));
            return true;
        }